

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeDestroy(sqlite3_vtab *pVtab)

{
  char *zSql;
  char *zCreate;
  int rc;
  Rtree *pRtree;
  sqlite3_vtab *pVtab_local;
  
  zSql = sqlite3_mprintf("DROP TABLE \'%q\'.\'%q_node\';DROP TABLE \'%q\'.\'%q_rowid\';DROP TABLE \'%q\'.\'%q_parent\';"
                         ,pVtab[2].pModule,*(undefined8 *)&pVtab[2].nRef,pVtab[2].pModule,
                         *(undefined8 *)&pVtab[2].nRef,pVtab[2].pModule,
                         *(undefined8 *)&pVtab[2].nRef);
  if (zSql == (char *)0x0) {
    zCreate._4_4_ = 7;
  }
  else {
    nodeBlobReset((Rtree *)pVtab);
    zCreate._4_4_ =
         sqlite3_exec((sqlite3 *)pVtab[1].pModule,zSql,(sqlite3_callback)0x0,(void *)0x0,
                      (char **)0x0);
    sqlite3_free(zSql);
  }
  if (zCreate._4_4_ == 0) {
    rtreeRelease((Rtree *)pVtab);
  }
  return zCreate._4_4_;
}

Assistant:

static int rtreeDestroy(sqlite3_vtab *pVtab){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc;
  char *zCreate = sqlite3_mprintf(
    "DROP TABLE '%q'.'%q_node';"
    "DROP TABLE '%q'.'%q_rowid';"
    "DROP TABLE '%q'.'%q_parent';",
    pRtree->zDb, pRtree->zName, 
    pRtree->zDb, pRtree->zName,
    pRtree->zDb, pRtree->zName
  );
  if( !zCreate ){
    rc = SQLITE_NOMEM;
  }else{
    nodeBlobReset(pRtree);
    rc = sqlite3_exec(pRtree->db, zCreate, 0, 0, 0);
    sqlite3_free(zCreate);
  }
  if( rc==SQLITE_OK ){
    rtreeRelease(pRtree);
  }

  return rc;
}